

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlFAParsePosCharGroup(xmlRegParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar xVar2;
  byte *pbVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  uint start;
  uint end;
  int neg;
  char *extra;
  xmlRegAtomPtr atom;
  bool bVar6;
  int local_34;
  
  do {
    pbVar3 = ctxt->cur;
    if (*pbVar3 == 0x5c) {
      xmlFAParseCharClassEsc(ctxt);
    }
    else {
      bVar1 = *pbVar3;
      if (bVar1 < 0x5c) {
        if (bVar1 == 0) {
          ctxt->error = 0x5aa;
          extra = "Expecting \']\'";
        }
        else {
          if (bVar1 == 0x5b) goto LAB_0017daf1;
LAB_0017daba:
          local_34 = 4;
          start = xmlGetUTF8Char(pbVar3,&local_34);
          if (-1 < (int)start) goto LAB_0017db6f;
LAB_0017dad4:
          ctxt->error = 0x5aa;
          extra = "Invalid UTF-8";
        }
LAB_0017db0d:
        xmlRegexpErrCompile(ctxt,extra);
      }
      else {
        if (bVar1 != 0x5c) {
          if (bVar1 != 0x5d) goto LAB_0017daba;
LAB_0017daf1:
          ctxt->error = 0x5aa;
          extra = "Expecting a char range";
          goto LAB_0017db0d;
        }
        ctxt->cur = pbVar3 + 1;
        start = (uint)pbVar3[1];
        if (start < 0x72) {
          if (((start - 0x28 < 0x37) &&
              ((0x7800000080006fU >> ((ulong)(start - 0x28) & 0x3f) & 1) != 0)) ||
             (bVar6 = start == 0x6e, start = 10, bVar6)) goto LAB_0017db67;
          goto LAB_0017dcad;
        }
        if (2 < start - 0x7b) {
          if (start == 0x74) {
            start = 9;
          }
          else {
            if (start != 0x72) goto LAB_0017dcad;
            start = 0xd;
          }
        }
LAB_0017db67:
        local_34 = 1;
LAB_0017db6f:
        if (((start == 0x2d) && (pxVar4 = ctxt->cur, pxVar4[1] != ']')) &&
           ((pxVar4[-1] != '[' && (pxVar4[-1] != '^')))) {
          ctxt->cur = pxVar4 + local_34;
          goto LAB_0017dbd7;
        }
        pxVar5 = ctxt->cur;
        pxVar4 = pxVar5 + local_34;
        ctxt->cur = pxVar4;
        if (((pxVar5[local_34] == '-') && (pxVar4[1] != ']')) && (pxVar4[1] != '[')) {
          pbVar3 = pxVar4 + 1;
          ctxt->cur = pbVar3;
          bVar1 = *pbVar3;
          if (bVar1 < 0x5c) {
            if ((bVar1 == 0) || (bVar1 == 0x5b)) {
LAB_0017dc65:
              ctxt->error = 0x5aa;
              extra = "Expecting the end of a char range";
              goto LAB_0017db0d;
            }
LAB_0017dc7b:
            local_34 = 4;
            end = xmlGetUTF8Char(pbVar3,&local_34);
            if ((int)end < 0) goto LAB_0017dad4;
          }
          else {
            if (bVar1 == 0x5d) goto LAB_0017dc65;
            if (bVar1 != 0x5c) goto LAB_0017dc7b;
            ctxt->cur = pxVar4 + 2;
            bVar1 = pxVar4[2];
            end = (uint)bVar1;
            if (bVar1 < 0x72) {
              if (((0x36 < bVar1 - 0x28) ||
                  ((0x7800000080006fU >> ((ulong)(bVar1 - 0x28) & 0x3f) & 1) == 0)) &&
                 (end = 10, bVar1 != 0x6e)) {
LAB_0017dcad:
                ctxt->error = 0x5aa;
                extra = "Invalid escape value";
                goto LAB_0017db0d;
              }
            }
            else if (2 < end - 0x7b) {
              if (bVar1 == 0x74) {
                end = 9;
              }
              else {
                if (bVar1 != 0x72) goto LAB_0017dcad;
                end = 0xd;
              }
            }
            local_34 = 1;
          }
          if ((int)end < (int)start) {
            ctxt->error = 0x5aa;
            extra = "End of range is before start of range";
            goto LAB_0017db0d;
          }
          ctxt->cur = ctxt->cur + local_34;
          atom = ctxt->atom;
          neg = ctxt->neg;
        }
        else {
          atom = ctxt->atom;
          neg = ctxt->neg;
          end = start;
        }
        xmlRegAtomAddRange(ctxt,atom,neg,XML_REGEXP_CHARVAL,start,end,(xmlChar *)0x0);
      }
    }
LAB_0017dbd7:
    xVar2 = *ctxt->cur;
    if (((xVar2 == '\0') || (xVar2 == '-')) || ((xVar2 == ']' || (ctxt->error != 0)))) {
      return;
    }
  } while( true );
}

Assistant:

static void
xmlFAParsePosCharGroup(xmlRegParserCtxtPtr ctxt) {
    do {
	if (CUR == '\\') {
	    xmlFAParseCharClassEsc(ctxt);
	} else {
	    xmlFAParseCharRange(ctxt);
	}
    } while ((CUR != ']') && (CUR != '-') &&
             (CUR != 0) && (ctxt->error == 0));
}